

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int BUFFER_append_build(BUFFER_HANDLE handle,uchar *source,size_t size)

{
  size_t sVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  uchar *puVar4;
  size_t __size;
  
  if ((source == (uchar *)0x0 || handle == (BUFFER_HANDLE)0x0) || size == 0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/buffer.c"
                ,"BUFFER_append_build",0xce,1,
                "BUFFER_append_build failed invalid parameter handle: %p, source: %p, size: %lu",
                handle,source,size);
      return 0xcf;
    }
    return 0xcf;
  }
  if (handle->buffer == (uchar *)0x0) {
    iVar2 = BUFFER_safemalloc(handle,size);
    if ((iVar2 != 0) || (handle->buffer == (uchar *)0x0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/buffer.c"
                  ,"BUFFER_append_build",0xd9,1,"Failure with BUFFER_safemalloc");
        return 0xda;
      }
      return 0xda;
    }
    memcpy(handle->buffer,source,size);
  }
  else {
    __size = 0xffffffffffffffff;
    if (!CARRY8(handle->size,size)) {
      __size = handle->size + size;
    }
    if ((__size == 0xffffffffffffffff) ||
       (puVar4 = (uchar *)realloc(handle->buffer,__size), puVar4 == (uchar *)0x0)) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0xee;
      }
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/buffer.c"
                ,"BUFFER_append_build",0xed,1,"Failure reallocating temporary buffer, size:%zu",
                __size);
      return 0xee;
    }
    handle->buffer = puVar4;
    sVar1 = handle->size;
    memcpy(puVar4 + sVar1,source,size);
    handle->size = sVar1 + size;
  }
  return 0;
}

Assistant:

int BUFFER_append_build(BUFFER_HANDLE handle, const unsigned char* source, size_t size)
{
    int result;
    if (handle == NULL || source == NULL || size == 0)
    {
        /* Codes_SRS_BUFFER_07_029: [ BUFFER_append_build shall return nonzero if handle or source are NULL or if size is 0. ] */
        LogError("BUFFER_append_build failed invalid parameter handle: %p, source: %p, size: %lu", handle, source, (unsigned long)size);
        result = MU_FAILURE;
    }
    else
    {
        if (handle->buffer == NULL)
        {
            /* Codes_SRS_BUFFER_07_030: [ if handle->buffer is NULL BUFFER_append_build shall allocate the a buffer of size bytes... ] */
            if (BUFFER_safemalloc(handle, size) != 0 || handle->buffer == NULL)
            {
                /* Codes_SRS_BUFFER_07_035: [ If any error is encountered BUFFER_append_build shall return a non-null value. ] */
                LogError("Failure with BUFFER_safemalloc");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_BUFFER_07_031: [ ... and copy the contents of source to handle->buffer. ] */
                (void)memcpy(handle->buffer, source, size);
                /* Codes_SRS_BUFFER_07_034: [ On success BUFFER_append_build shall return 0 ] */
                result = 0;
            }
        }
        else
        {
            /* Codes_SRS_BUFFER_07_032: [ if handle->buffer is not NULL BUFFER_append_build shall realloc the buffer to be the handle->size + size ] */
            unsigned char* temp;
            size_t malloc_size = safe_add_size_t(handle->size, size);
            if (malloc_size == SIZE_MAX || 
                (temp = (unsigned char*)realloc(handle->buffer, malloc_size)) == NULL)
            {
                /* Codes_SRS_BUFFER_07_035: [ If any error is encountered BUFFER_append_build shall return a non-null value. ] */
                LogError("Failure reallocating temporary buffer, size:%zu", malloc_size);
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_BUFFER_07_033: [ ... and copy the contents of source to the end of the buffer. ] */
                handle->buffer = temp;
                // Append the BUFFER
                (void)memcpy(&handle->buffer[handle->size], source, size);
                handle->size += size;
                /* Codes_SRS_BUFFER_07_034: [ On success BUFFER_append_build shall return 0 ] */
                result = 0;
            }
        }
    }
    return result;
}